

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O2

void __thiscall json_service::compiles4v(json_service *this,value *f)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  runtime_error *this_00;
  string local_1b0 [32];
  ostringstream oss;
  
  iVar1 = cppcms::json::value::type();
  if (iVar1 == 5) {
    lVar2 = cppcms::json::value::object();
    if (*(long *)(lVar2 + 0x28) == 0) {
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,100);
  std::operator<<(poVar3," f.type()==cppcms::json::is_object && f.object().empty()");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles4v(cppcms::json::value f) {  TEST(f.type()==cppcms::json::is_object && f.object().empty()); }